

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_BlitRotate(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,float x,float y,
                   float degrees)

{
  GPU_Target *pGVar1;
  char *pcVar2;
  GPU_ErrorEnum GStack_30;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar2 = "NULL renderer";
  }
  else {
    pGVar1 = _gpu_current_renderer->current_context_target;
    if (target == (GPU_Target *)0x0 || pGVar1 != (GPU_Target *)0x0) {
LAB_00137c88:
      if (pGVar1 != (GPU_Target *)0x0) {
        if (image == (GPU_Image *)0x0) {
          pcVar2 = "image";
        }
        else {
          if (target != (GPU_Target *)0x0) {
            (*_gpu_current_renderer->impl->BlitRotate)
                      (_gpu_current_renderer,image,src_rect,target,x,y,degrees);
            return;
          }
          pcVar2 = "target";
        }
        GStack_30 = GPU_ERROR_NULL_ARGUMENT;
        goto LAB_00137d14;
      }
    }
    else if (target->context != (GPU_Context *)0x0) {
      GPU_MakeCurrent(target,target->context->windowID);
      pGVar1 = _gpu_current_renderer->current_context_target;
      goto LAB_00137c88;
    }
    pcVar2 = "NULL context";
  }
  GStack_30 = GPU_ERROR_USER_ERROR;
LAB_00137d14:
  GPU_PushErrorCode("GPU_BlitRotate",GStack_30,"%s",pcVar2);
  return;
}

Assistant:

void GPU_BlitRotate(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, float x, float y, float degrees)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(image == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "image");
    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    _gpu_current_renderer->impl->BlitRotate(_gpu_current_renderer, image, src_rect, target, x, y, degrees);
}